

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::GetProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  Type *pTVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  charcount_t cVar6;
  int extraout_EAX;
  int iVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *pRVar11;
  long lVar12;
  Type *pTVar13;
  undefined1 local_58 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = info;
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  bVar4 = PropertyRecord::IsPropertyNameNumeric(pcVar8,cVar6);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x217,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit(local_58);
  local_58 = (undefined1  [8])pcVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_58);
  bVar4 = 0 < this->propertyCount;
  iVar7 = extraout_EAX;
  propertyName.string.ptr._0_4_ = cVar6;
  if (0 < this->propertyCount) {
    pTVar13 = this->descriptors;
    bVar5 = PropertyRecord::Equals
                      (this->descriptors[0].Id.ptr,(CharacterBuffer<char16_t> *)local_58);
    lVar12 = 0;
    if (!bVar5) {
      do {
        lVar12 = lVar12 + 1;
        iVar7 = this->propertyCount;
        bVar4 = lVar12 < iVar7;
        if (iVar7 <= lVar12) goto LAB_00e51884;
        pTVar1 = pTVar13 + 1;
        pTVar13 = pTVar13 + 1;
        bVar5 = PropertyRecord::Equals((pTVar1->Id).ptr,(CharacterBuffer<char16_t> *)local_58);
      } while (!bVar5);
    }
    if (((pTVar13->field_1).Attributes & 8) == 0) {
      pvVar10 = DynamicObject::GetSlot(instance,(int)lVar12);
      *value = pvVar10;
      iVar7 = 1;
      if (propertyName._8_8_ != 0) {
        TVar2 = (pTVar13->field_1).Attributes;
        *(DynamicObject **)propertyName._8_8_ = instance;
        *(short *)(propertyName._8_8_ + 8) = (short)lVar12;
        *(Type *)(propertyName._8_8_ + 10) = TVar2;
        *(undefined1 *)(propertyName._8_8_ + 0xb) = 0;
      }
    }
    else {
      pRVar11 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar11;
      iVar7 = 0;
    }
  }
LAB_00e51884:
  if (!bVar4) {
    pRVar11 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar11;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }